

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-intermediate.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  string *fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1f8;
  Solution solution;
  Parameters parameters;
  Problem problem;
  SolutionGraph solutionGraph;
  ProblemGraph problemGraph;
  
  parseCommandLine(&parameters,argc,argv);
  lineage::loadProblem(&problem,&parameters.nodesFileName,&parameters.edgesFileName);
  lineage::ProblemGraph::ProblemGraph(&problemGraph,&problem);
  fileName = &parameters.solutionName;
  lineage::loadSolution(&solution,fileName);
  lineage::SolutionGraph::SolutionGraph(&solutionGraph,&problemGraph,&solution);
  std::__cxx11::string::substr((ulong)&bStack_1f8,(ulong)fileName);
  std::__cxx11::string::operator=((string *)fileName,(string *)&bStack_1f8);
  std::__cxx11::string::~string((string *)&bStack_1f8);
  lineage::SolutionGraph::save(&solutionGraph,fileName);
  std::operator+(&bStack_1f8,fileName,"-lineage-tree.svg");
  lineage::SolutionGraph::saveSVG(&solutionGraph,&bStack_1f8);
  std::__cxx11::string::~string((string *)&bStack_1f8);
  lineage::SolutionGraph::~SolutionGraph(&solutionGraph);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&solution);
  lineage::ProblemGraph::~ProblemGraph(&problemGraph);
  lineage::Problem::~Problem(&problem);
  Parameters::~Parameters(&parameters);
  return 0;
}

Assistant:

int main(int argc, char** argv)
try
{
    auto parameters = parseCommandLine(argc, argv);

    // load problem:
    auto problem = lineage::loadProblem(parameters.nodesFileName, parameters.edgesFileName);

    lineage::ProblemGraph problemGraph(problem);

    auto solution = lineage::loadSolution(parameters.solutionName);
    
    lineage::SolutionGraph solutionGraph(problemGraph, solution);

    parameters.solutionName = parameters.solutionName.substr(0, parameters.solutionName.size() - 4);
    solutionGraph.save(parameters.solutionName);
    solutionGraph.saveSVG(parameters.solutionName + "-lineage-tree.svg");

    return 0;
}
catch(const runtime_error& error) {
    cerr << "error: " << error.what() << endl;
    return 1;
}